

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O3

QVariantHash __thiscall QCborMap::toVariantHash(QCborMap *this)

{
  qsizetype qVar1;
  QCborMap *in_RSI;
  long idx;
  long in_FS_OFFSET;
  QString local_88;
  QCborValue local_70;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->d).d.ptr = (QCborContainerPrivate *)0x0;
  qVar1 = size(in_RSI);
  QHash<QString,_QVariant>::reserve((QHash<QString,_QVariant> *)this,qVar1);
  qVar1 = size(in_RSI);
  if (0 < qVar1) {
    idx = 0;
    do {
      makeString(&local_88,(in_RSI->d).d.ptr,idx,FromRaw);
      QCborContainerPrivate::valueAt(&local_70,(in_RSI->d).d.ptr,idx + 1);
      QCborValue::toVariant(&local_58,(QCborValue *)&local_70);
      QHash<QString,QVariant>::emplace<QVariant_const&>
                ((QHash<QString,QVariant> *)this,&local_88,&local_58);
      ::QVariant::~QVariant(&local_58);
      QCborValue::~QCborValue((QCborValue *)&local_70);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
      qVar1 = size(in_RSI);
      idx = idx + 2;
    } while (SBORROW8(idx,qVar1 * 2) != idx + qVar1 * -2 < 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QVariantHash)(Data *)this;
  }
  __stack_chk_fail();
}

Assistant:

QVariantHash QCborMap::toVariantHash() const
{
    QVariantHash retval;
    retval.reserve(size());
    for (qsizetype i = 0; i < 2 * size(); i += 2)
        retval.insert(makeString(d.data(), i), d->valueAt(i + 1).toVariant());
    return retval;
}